

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3ArenaTest_MessageFieldClearViaReflection_Test::
~Proto3ArenaTest_MessageFieldClearViaReflection_Test
          (Proto3ArenaTest_MessageFieldClearViaReflection_Test *this)

{
  Proto3ArenaTest_MessageFieldClearViaReflection_Test *this_local;
  
  ~Proto3ArenaTest_MessageFieldClearViaReflection_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3ArenaTest, MessageFieldClearViaReflection) {
  Arena arena;
  TestAllTypes* message = Arena::Create<TestAllTypes>(&arena);
  const Reflection* r = message->GetReflection();
  const Descriptor* d = message->GetDescriptor();
  const FieldDescriptor* msg_field =
      d->FindFieldByName("optional_nested_message");

  message->mutable_optional_nested_message()->set_bb(1);
  r->ClearField(message, msg_field);
  EXPECT_FALSE(message->has_optional_nested_message());
  EXPECT_EQ(0, message->optional_nested_message().bb());
}